

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_from_text_w(archive_acl *acl,wchar_t *text,wchar_t want_type)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  long lVar6;
  wchar_t *pwVar7;
  int *piVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  ulong uVar14;
  wchar_t wVar15;
  wchar_t *pwVar16;
  wchar_t *pwVar17;
  wchar_t wVar18;
  uint uVar19;
  ulong uVar20;
  wchar_t *pwVar21;
  wchar_t wVar22;
  ulong uVar23;
  ulong uVar24;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_ec;
  wchar_t *local_e8;
  wchar_t local_dc;
  wchar_t *local_d8;
  wchar_t *local_d0;
  ulong local_c8;
  wchar_t local_bc;
  wchar_t local_b8;
  uint local_b4;
  archive_acl *local_b0;
  ulong local_a8;
  long local_a0;
  wchar_t *local_98;
  long local_90;
  wchar_t *local_88 [5];
  long alStack_60 [6];
  
  local_b4 = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_b4 = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar5 = L'\0';
  local_b0 = acl;
  if (text == (wchar_t *)0x0) {
    local_bc = L'\0';
  }
  else {
    local_bc = L'\0';
    local_b8 = want_type;
    if (*text != L'\0') {
      uVar23 = (ulong)local_b4;
      local_a0 = uVar23 + 0xfffffffe;
      uVar20 = 0;
      local_bc = L'\0';
LAB_003fd456:
      uVar24 = 0;
      do {
        while ((uVar14 = uVar24, uVar24 = (ulong)(uint)*text, pwVar21 = text, uVar24 < 0x21 &&
               ((0x100000600U >> (uVar24 & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar24 = uVar14;
        }
        while ((uVar10 = (uint)uVar24, 0x3a < uVar10 ||
               (pwVar16 = pwVar21, (0x400100000000401U >> (uVar24 & 0x3f) & 1) == 0))) {
          uVar24 = (ulong)(uint)pwVar21[1];
          pwVar21 = pwVar21 + 1;
        }
        do {
          pwVar17 = pwVar16;
          if (0x20 < (ulong)(uint)pwVar17[-1]) break;
          pwVar16 = pwVar17 + -1;
        } while ((0x100000600U >> ((ulong)(uint)pwVar17[-1] & 0x3f) & 1) != 0);
        if (uVar14 < uVar23) {
          (&local_98)[uVar14 * 2] = text;
          (&local_90)[uVar14 * 2] = (long)pwVar17;
        }
        text = pwVar21 + (uVar10 != 0);
        uVar24 = uVar14 + 1;
      } while (uVar10 == 0x3a);
      uVar19 = (uint)uVar14;
      local_a8 = uVar20;
      if ((uint)(uVar14 + 1) < local_b4) {
        memset(local_88 + uVar14 * 2,0,(ulong)((int)local_a0 - uVar19) * 0x10 + 0x10);
      }
      pwVar16 = local_98;
      if ((local_98 != (wchar_t *)0x0) && (*local_98 == L'#')) {
        uVar20 = local_a8 & 0xffffffff;
        goto LAB_003fde41;
      }
      uVar24 = local_90 - (long)local_98;
      local_ec = L'\0';
      if (local_b8 == L'㰀') {
        uVar20 = 0xffffffec;
        switch((long)uVar24 >> 2) {
        case 4:
          iVar3 = wmemcmp(local_98,anon_var_dwarf_16cb9dd,4);
          if (iVar3 != 0) break;
          wVar18 = L'✑';
LAB_003fd808:
          iVar3 = 1;
          wVar5 = L'\xffffffff';
          pwVar16 = local_88[1];
          pwVar17 = local_88[0];
          if (local_88[0] < local_88[1]) {
            wVar22 = L'\0';
            pwVar7 = local_88[0];
            do {
              wVar12 = *pwVar7;
              wVar5 = L'\xffffffff';
              if ((uint)(wVar12 + L'\xffffffc6') < 0xfffffff6) break;
              wVar5 = L'\x7fffffff';
              if ((wVar22 < L'\x0ccccccd') && ((wVar22 != L'\x0ccccccc' || ((uint)wVar12 < 0x38))))
              {
                wVar5 = wVar12 + wVar22 * 10 + L'\xffffffd0';
              }
              wVar22 = wVar5;
              pwVar7 = pwVar7 + 1;
              wVar5 = wVar22;
            } while (pwVar7 < local_88[1]);
            iVar3 = 1;
          }
LAB_003fda68:
          uVar20 = 0xffffffec;
          local_c8 = (ulong)(uint)(iVar3 << 4);
          piVar8 = *(int **)((long)local_88 + local_c8);
          piVar2 = *(int **)((long)local_88 + local_c8 + 8);
          wVar22 = L'\0';
          if (piVar8 < piVar2) {
            wVar22 = L'\0';
LAB_003fda8e:
            iVar3 = *piVar8;
            if (iVar3 < 99) {
              if (iVar3 < 0x44) {
                if (iVar3 == 0x2d) goto LAB_003fdb5d;
                if (iVar3 == 0x41) {
                  uVar19 = 0x400;
                  goto LAB_003fdb5a;
                }
                if (iVar3 != 0x43) goto switchD_003fdacd_caseD_71;
                uVar19 = 0x2000;
              }
              else if (iVar3 < 0x57) {
                if (iVar3 == 0x44) {
                  uVar19 = 0x100;
                  goto LAB_003fdb5a;
                }
                if (iVar3 != 0x52) goto switchD_003fdacd_caseD_71;
                uVar19 = 0x40;
              }
              else if (iVar3 == 0x57) {
                uVar19 = 0x80;
              }
              else {
                if (iVar3 != 0x61) goto switchD_003fdacd_caseD_71;
                uVar19 = 0x200;
              }
            }
            else {
              switch(iVar3) {
              case 0x6f:
                uVar19 = 0x4000;
                break;
              case 0x70:
                uVar19 = 0x20;
                break;
              case 0x71:
              case 0x74:
              case 0x75:
              case 0x76:
                goto switchD_003fdacd_caseD_71;
              case 0x72:
                uVar19 = 8;
                break;
              case 0x73:
                uVar19 = 0x8000;
                break;
              case 0x77:
                uVar19 = 0x10;
                break;
              case 0x78:
                uVar19 = 1;
                break;
              default:
                if (iVar3 == 99) {
                  uVar19 = 0x1000;
                }
                else {
                  if (iVar3 != 100) goto switchD_003fdacd_caseD_71;
                  uVar19 = 0x800;
                }
              }
            }
LAB_003fdb5a:
            wVar22 = wVar22 | uVar19;
LAB_003fdb5d:
            piVar8 = piVar8 + 1;
            local_ec = wVar22;
            if (piVar2 <= piVar8) goto LAB_003fdb74;
            goto LAB_003fda8e;
          }
LAB_003fdb74:
          piVar8 = *(int **)((long)local_88 + local_c8 + 0x10);
          piVar2 = *(int **)((long)local_88 + local_c8 + 0x18);
          if (piVar8 < piVar2) {
LAB_003fdb8d:
            iVar3 = *piVar8;
            if (iVar3 < 100) {
              if (iVar3 < 0x49) {
                if (iVar3 != 0x2d) {
                  if (iVar3 == 0x46) {
                    uVar19 = 0x40000000;
                    goto LAB_003fdc04;
                  }
                  goto switchD_003fdacd_caseD_71;
                }
                goto LAB_003fdc07;
              }
              if (iVar3 == 0x49) {
                uVar19 = 0x1000000;
                goto LAB_003fdc04;
              }
              if (iVar3 != 0x53) goto switchD_003fdacd_caseD_71;
              uVar19 = 0x20000000;
            }
            else if (iVar3 < 0x69) {
              if (iVar3 == 100) {
                uVar19 = 0x4000000;
              }
              else {
                uVar19 = 0x2000000;
                if (iVar3 != 0x66) goto switchD_003fdacd_caseD_71;
              }
            }
            else if (iVar3 == 0x69) {
              uVar19 = 0x10000000;
            }
            else {
              if (iVar3 != 0x6e) goto switchD_003fdacd_caseD_71;
              uVar19 = 0x8000000;
            }
LAB_003fdc04:
            wVar22 = wVar22 | uVar19;
LAB_003fdc07:
            piVar8 = piVar8 + 1;
            local_ec = wVar22;
            if (piVar2 <= piVar8) goto LAB_003fdc1e;
            goto LAB_003fdb8d;
          }
LAB_003fdc1e:
          pwVar7 = *(wchar_t **)((long)local_88 + local_c8 + 0x20);
          lVar6 = *(long *)((long)alStack_60 + local_c8) - (long)pwVar7;
          if (lVar6 != 0x14) {
            if ((lVar6 == 0x10) &&
               (local_dc = wVar18, local_d8 = pwVar16, local_d0 = pwVar17,
               iVar3 = wmemcmp(pwVar7,anon_var_dwarf_16cba2c,4), iVar3 == 0)) {
              wVar18 = L'ࠀ';
              goto LAB_003fdcfe;
            }
            goto switchD_003fd566_caseD_7;
          }
          local_e8 = pwVar7;
          local_dc = wVar18;
          local_d8 = pwVar16;
          local_d0 = pwVar17;
          iVar3 = wmemcmp(pwVar7,anon_var_dwarf_16cba37,5);
          if (iVar3 == 0) {
            wVar18 = L'Ѐ';
          }
          else {
            iVar3 = wmemcmp(local_e8,anon_var_dwarf_16cba42,5);
            if (iVar3 == 0) {
              wVar18 = L'က';
            }
            else {
              iVar3 = wmemcmp(local_e8,anon_var_dwarf_16cba4d,5);
              if (iVar3 != 0) goto switchD_003fd566_caseD_7;
              wVar18 = L'\x2000';
            }
          }
LAB_003fdcfe:
          puVar9 = *(uint **)((long)alStack_60 + local_c8 + 8);
          puVar1 = *(uint **)((long)alStack_60 + local_c8 + 0x10);
          pwVar16 = local_d0;
          pwVar17 = local_d8;
          wVar12 = local_dc;
          wVar15 = wVar5;
          if (puVar9 < puVar1) {
            wVar13 = L'\0';
            do {
              uVar19 = *puVar9;
              wVar15 = wVar5;
              if (uVar19 - 0x3a < 0xfffffff6) break;
              wVar15 = L'\x7fffffff';
              if ((wVar13 < L'\x0ccccccd') && ((wVar13 != L'\x0ccccccc' || (uVar19 < 0x38)))) {
                wVar15 = uVar19 + wVar13 * 10 + L'\xffffffd0';
              }
              wVar13 = wVar15;
              puVar9 = puVar9 + 1;
              wVar15 = wVar13;
            } while (puVar9 < puVar1);
          }
          goto LAB_003fddfe;
        case 5:
          iVar3 = wmemcmp(local_98,anon_var_dwarf_16cb9e8,5);
          if (iVar3 == 0) {
            wVar18 = L'✓';
            goto LAB_003fd808;
          }
          break;
        case 6:
          iVar3 = wmemcmp(local_98,anon_var_dwarf_16cb9ff,6);
          if (iVar3 == 0) {
            wVar18 = L'✒';
LAB_003fda35:
            iVar3 = 0;
            wVar5 = L'\xffffffff';
            pwVar16 = (wchar_t *)0x0;
            pwVar17 = (wchar_t *)0x0;
            goto LAB_003fda68;
          }
          iVar3 = wmemcmp(pwVar16,anon_var_dwarf_16cba0a,6);
          if (iVar3 == 0) {
            wVar18 = L'✔';
            goto LAB_003fda35;
          }
          goto LAB_003fd8ce;
        default:
          goto switchD_003fd566_caseD_7;
        case 9:
          iVar3 = wmemcmp(local_98,anon_var_dwarf_16cba15,9);
          if (iVar3 == 0) {
            wVar5 = L'\xffffffff';
            wVar18 = L'❻';
            iVar3 = 0;
            pwVar16 = (wchar_t *)0x0;
            pwVar17 = (wchar_t *)0x0;
            goto LAB_003fda68;
          }
        }
        goto LAB_003fde41;
      }
      local_c8 = 0;
      wVar18 = local_b8;
      if (*local_98 == L'd') {
        if (uVar24 == 4) {
LAB_003fd5ab:
          local_c8 = 1;
          wVar18 = L'Ȁ';
        }
        else if (0x18 < uVar24) {
          local_d8 = local_98;
          iVar3 = wmemcmp(local_98 + 1,anon_var_dwarf_16cb982,6);
          wVar18 = local_b8;
          if (iVar3 == 0) {
            if (uVar24 == 0x1c) goto LAB_003fd5ab;
            local_98 = local_d8 + 7;
            wVar18 = L'Ȁ';
          }
        }
      }
      iVar3 = (int)local_c8;
      uVar20 = (ulong)((iVar3 + 1U) * 0x10);
      pwVar16 = *(wchar_t **)((long)&local_98 + uVar20);
      pwVar17 = *(wchar_t **)((long)&local_90 + uVar20);
      if (pwVar16 < pwVar17) {
        wVar15 = L'\0';
        pwVar7 = pwVar16;
        do {
          wVar5 = *pwVar7;
          if ((uint)(wVar5 + L'\xffffffc6') < 0xfffffff6) goto LAB_003fd648;
          wVar22 = L'\x7fffffff';
          if ((wVar15 < L'\x0ccccccd') && ((wVar15 != L'\x0ccccccc' || ((uint)wVar5 < 0x38)))) {
            wVar22 = wVar5 + wVar15 * 10 + L'\xffffffd0';
          }
          wVar15 = wVar22;
          pwVar7 = pwVar7 + 1;
        } while (pwVar7 < pwVar17);
        if (wVar15 == L'\xffffffff') goto LAB_003fd648;
      }
      else {
LAB_003fd648:
        if (iVar3 + 3U <= uVar19) {
          uVar20 = (ulong)((iVar3 + 3U) * 0x10);
          puVar9 = *(uint **)((long)&local_98 + uVar20);
          puVar1 = *(uint **)((long)&local_90 + uVar20);
          if (puVar9 < puVar1) {
            wVar5 = L'\0';
            do {
              uVar11 = *puVar9;
              if (uVar11 - 0x3a < 0xfffffff6) goto LAB_003fd6a3;
              wVar15 = L'\x7fffffff';
              if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (uVar11 < 0x38)))) {
                wVar15 = uVar11 + wVar5 * 10 + L'\xffffffd0';
              }
              puVar9 = puVar9 + 1;
              wVar5 = wVar15;
            } while (puVar9 < puVar1);
            goto LAB_003fd6a9;
          }
        }
LAB_003fd6a3:
        wVar15 = L'\xffffffff';
      }
LAB_003fd6a9:
      piVar8 = *(int **)((long)&local_98 + (ulong)(uint)(iVar3 << 4));
      uVar11 = *piVar8 - 0x67U >> 1 | (uint)((*piVar8 - 0x67U & 1) != 0) << 0x1f;
      if (7 < uVar11) goto switchD_003fd6e0_caseD_1;
      lVar6 = *(long *)((long)&local_90 + (ulong)(uint)(iVar3 << 4)) - (long)piVar8;
      pwVar7 = piVar8 + 1;
      switch(uVar11) {
      case 0:
        wVar5 = L'✔';
        wVar12 = L'✓';
        if (lVar6 == 4) goto LAB_003fd9d7;
        uVar20 = 0xffffffec;
        if (lVar6 == 0x14) {
          local_e8 = (wchar_t *)CONCAT44(local_e8._4_4_,wVar18);
          local_d8 = pwVar17;
          local_d0 = pwVar16;
          iVar3 = wmemcmp(pwVar7,anon_var_dwarf_16cb9e8 + 1,4);
          wVar12 = L'✓';
          wVar18 = (wchar_t)local_e8;
LAB_003fd964:
          uVar20 = 0xffffffec;
          pwVar16 = local_d0;
          pwVar17 = local_d8;
          if (iVar3 == 0) goto LAB_003fd9d7;
        }
        goto switchD_003fd566_caseD_7;
      default:
        goto switchD_003fd6e0_caseD_1;
      case 3:
        wVar12 = L'✕';
        if (lVar6 != 4) {
          if (lVar6 == 0x10) {
            local_e8 = (wchar_t *)CONCAT44(local_e8._4_4_,wVar18);
            local_d8 = pwVar17;
            local_d0 = pwVar16;
            iVar4 = wmemcmp(pwVar7,anon_var_dwarf_16cbb22 + 1,3);
            wVar12 = L'✕';
            wVar18 = (wchar_t)local_e8;
LAB_003fd8b2:
            pwVar16 = local_d0;
            pwVar17 = local_d8;
            if (iVar4 == 0) goto LAB_003fd97d;
          }
          goto switchD_003fd6e0_caseD_1;
        }
LAB_003fd97d:
        if (iVar3 + 1U == uVar19) {
          if (pwVar16 < pwVar17) {
            local_e8 = (wchar_t *)CONCAT44(local_e8._4_4_,wVar18);
            local_dc = wVar12;
            wVar5 = ismode_w(pwVar16,pwVar17,&local_ec);
            wVar18 = (wchar_t)local_e8;
            wVar12 = local_dc;
            if (wVar5 != L'\0') {
              iVar3 = -1;
              pwVar17 = (wchar_t *)0x0;
              pwVar16 = (wchar_t *)0x0;
              break;
            }
            if ((int)local_c8 + 2U == uVar19) goto switchD_003fd6e0_caseD_1;
          }
LAB_003fdd8b:
          pwVar17 = (wchar_t *)0x0;
          pwVar16 = (wchar_t *)0x0;
          iVar3 = 0;
        }
        else {
          if ((int)local_c8 + 2U != uVar19) goto LAB_003fdd8b;
          uVar20 = 0xffffffec;
          if (pwVar16 < pwVar17) goto switchD_003fd566_caseD_7;
          pwVar17 = (wchar_t *)0x0;
          pwVar16 = (wchar_t *)0x0;
          iVar3 = 0;
        }
        break;
      case 4:
        wVar12 = L'✖';
        if (lVar6 == 4) goto LAB_003fd97d;
        if (lVar6 == 0x14) {
          local_e8 = (wchar_t *)CONCAT44(local_e8._4_4_,wVar18);
          local_d8 = pwVar17;
          local_d0 = pwVar16;
          iVar4 = wmemcmp(pwVar7,anon_var_dwarf_16cbb2d + 1,4);
          wVar12 = L'✖';
          wVar18 = (wchar_t)local_e8;
          goto LAB_003fd8b2;
        }
        goto switchD_003fd6e0_caseD_1;
      case 7:
        wVar5 = L'✒';
        wVar12 = L'✑';
        if (lVar6 != 4) {
          uVar20 = 0xffffffec;
          if (lVar6 == 0x10) {
            local_e8 = (wchar_t *)CONCAT44(local_e8._4_4_,wVar18);
            local_d8 = pwVar17;
            local_d0 = pwVar16;
            iVar3 = wmemcmp(pwVar7,anon_var_dwarf_16cb9dd + 1,3);
            wVar12 = L'✑';
            wVar18 = (wchar_t)local_e8;
            goto LAB_003fd964;
          }
          goto switchD_003fd566_caseD_7;
        }
LAB_003fd9d7:
        iVar3 = 0;
        if ((pwVar17 <= pwVar16) && (iVar3 = 0, wVar15 == L'\xffffffff')) {
          pwVar17 = (wchar_t *)0x0;
          pwVar16 = (wchar_t *)0x0;
          wVar12 = wVar5;
        }
      }
      uVar20 = 0xffffffec;
      wVar22 = local_ec;
      if (local_ec == L'\0') {
        local_e8 = (wchar_t *)CONCAT44(local_e8._4_4_,wVar18);
        uVar24 = (ulong)(iVar3 + (int)local_c8 + 2);
        local_dc = wVar12;
        local_d8 = pwVar17;
        local_d0 = pwVar16;
        wVar5 = ismode_w((&local_98)[uVar24 * 2],(wchar_t *)(&local_90)[uVar24 * 2],&local_ec);
        if (wVar5 != L'\0') {
          pwVar16 = local_d0;
          pwVar17 = local_d8;
          wVar18 = (wchar_t)local_e8;
          wVar12 = local_dc;
          wVar22 = local_ec;
          goto LAB_003fddfe;
        }
      }
      else {
LAB_003fddfe:
        wVar5 = archive_acl_add_entry_w_len
                          (local_b0,wVar18,wVar22,wVar12,wVar15,pwVar16,
                           (long)pwVar17 - (long)pwVar16 >> 2);
        if (wVar5 < L'\xffffffec') {
          return wVar5;
        }
        uVar19 = (uint)local_a8;
        if (wVar5 != L'\0') {
          uVar19 = 0xffffffec;
        }
        local_bc = local_bc | wVar18;
        uVar20 = (ulong)uVar19;
      }
      goto switchD_003fd566_caseD_7;
    }
  }
LAB_003fde5b:
  archive_acl_reset(local_b0,local_bc);
  return wVar5;
switchD_003fdacd_caseD_71:
  local_ec = wVar22;
switchD_003fd566_caseD_7:
LAB_003fde41:
  wVar5 = (wchar_t)uVar20;
  text = pwVar21 + (uVar10 != 0);
  if (*text == L'\0') goto LAB_003fde5b;
  goto LAB_003fd456;
switchD_003fd6e0_caseD_1:
LAB_003fd8ce:
  uVar20 = 0xffffffec;
  goto LAB_003fde41;
}

Assistant:

int
archive_acl_from_text_w(struct archive_acl *acl, const wchar_t *text,
    int want_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[6], name;

	const wchar_t *s, *st;

	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	wchar_t sep;

	ret = ARCHIVE_OK;
	types = 0;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	while (text != NULL && *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == L'#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == L'd' && (len == 1 || (len >= 7
			    && wmemcmp((s + 1), L"efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint_w(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > n+3)
				isint_w(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case L'u':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case L'g':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case L'o':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case L'm':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode_w(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 2
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode_w(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (wmemcmp(s, L"user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (wmemcmp(s, L"group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (wmemcmp(s, L"owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (wmemcmp(s, L"group@", len) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (wmemcmp(s, L"everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint_w(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms_w(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags_w(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (wmemcmp(s, L"deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (wmemcmp(s, L"allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (wmemcmp(s, L"audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (wmemcmp(s, L"alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint_w(field[4 + n].start, field[4 + n].end, &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}